

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqrt_of_one_minus_x_squared.c
# Opt level: O0

void WebRtcSpl_SqrtOfOneMinusXSquared(int16_t *xQ15,size_t vector_length,int16_t *yQ15)

{
  int32_t iVar1;
  ulong uStack_30;
  int16_t tmp;
  size_t m;
  int32_t sq;
  int16_t *yQ15_local;
  size_t vector_length_local;
  int16_t *xQ15_local;
  
  for (uStack_30 = 0; uStack_30 < vector_length; uStack_30 = uStack_30 + 1) {
    iVar1 = WebRtcSpl_Sqrt(0x3fffffff - (int)xQ15[uStack_30] * (int)xQ15[uStack_30]);
    yQ15[uStack_30] = (int16_t)iVar1;
  }
  return;
}

Assistant:

void WebRtcSpl_SqrtOfOneMinusXSquared(int16_t *xQ15, size_t vector_length,
                                      int16_t *yQ15)
{
    int32_t sq;
    size_t m;
    int16_t tmp;

    for (m = 0; m < vector_length; m++)
    {
        tmp = xQ15[m];
        sq = tmp * tmp;  // x^2 in Q30
        sq = 1073741823 - sq; // 1-x^2, where 1 ~= 0.99999999906 is 1073741823 in Q30
        sq = WebRtcSpl_Sqrt(sq); // sqrt(1-x^2) in Q15
        yQ15[m] = (int16_t)sq;
    }
}